

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O0

TPZSavable * __thiscall
TPZRestoreClass<TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>_>::Restore
          (TPZRestoreClass<TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>_> *this)

{
  long *plVar1;
  TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_> *unaff_retaddr;
  TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_> *ptr;
  undefined8 local_30;
  
  plVar1 = (long *)operator_new(0x170);
  TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>::TPZGeoElMapped(unaff_retaddr);
  local_30 = (TPZSavable *)0x0;
  if (plVar1 != (long *)0x0) {
    local_30 = (TPZSavable *)((long)plVar1 + *(long *)(*plVar1 + -0x60));
  }
  return local_30;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }